

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool (anonymous_namespace)::qt_ends_with_impl<QStringView,QLatin1String>
               (QStringView haystack,QLatin1String needle,CaseSensitivity cs)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QLatin1StringView in_stack_00000000;
  QStringView in_stack_00000010;
  qsizetype needleLen;
  qsizetype haystackLen;
  undefined1 in_stack_ffffffffffffffa0 [16];
  bool local_39;
  QLatin1String local_28;
  QStringView local_18;
  long lVar5;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QStringView::isNull(&local_18);
  if (bVar1) {
    local_39 = QLatin1String::isNull((QLatin1String *)0x512265);
  }
  else {
    qVar3 = QStringView::size(&local_18);
    qVar4 = QLatin1String::size(&local_28);
    if (qVar3 == 0) {
      local_39 = qVar4 == 0;
    }
    else if (qVar3 < qVar4) {
      local_39 = false;
    }
    else {
      QStringView::last(in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._0_8_);
      iVar2 = QtPrivate::compareStrings(in_stack_00000010,in_stack_00000000,(CaseSensitivity)lVar5);
      local_39 = iVar2 == 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool qt_ends_with_impl(Haystack haystack, Needle needle, Qt::CaseSensitivity cs) noexcept
{
    if (haystack.isNull())
        return needle.isNull();
    const auto haystackLen = haystack.size();
    const auto needleLen = needle.size();
    if (haystackLen == 0)
        return needleLen == 0;
    if (haystackLen < needleLen)
        return false;

    return QtPrivate::compareStrings(haystack.last(needleLen), needle, cs) == 0;
}